

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O3

void golemeffects(monst *mon,int damtype,int dam)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  
  if (mon->data == mons + 0x106) {
    if (damtype == 6) {
      iVar1 = dam / 6;
      goto LAB_001ed719;
    }
    if ((damtype & 0xfffffffeU) != 2) {
      return;
    }
  }
  else {
    if (mon->data != mons + 0x10a) {
      return;
    }
    iVar1 = dam;
    if (damtype == 2) {
LAB_001ed719:
      if (iVar1 == 0) {
        return;
      }
      iVar1 = mon->mhpmax;
      if (iVar1 <= mon->mhp) {
        return;
      }
      iVar2 = mon->mhp + dam;
      if (iVar1 <= iVar2) {
        iVar2 = iVar1;
      }
      mon->mhp = iVar2;
      if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
        return;
      }
      pcVar3 = Monnam(mon);
      pline("%s seems healthier.",pcVar3);
      return;
    }
    if (damtype != 6) {
      return;
    }
  }
  if ((*(uint *)&mon->field_0x60 & 0xc00) == 0x400) {
    return;
  }
  mon_adjust_speed(mon,-1,(obj *)0x0);
  return;
}

Assistant:

void golemeffects(struct monst *mon, int damtype, int dam)
{
    int heal = 0, slow = 0;

    if (mon->data == &mons[PM_FLESH_GOLEM]) {
	if (damtype == AD_ELEC) heal = dam / 6;
	else if (damtype == AD_FIRE || damtype == AD_COLD) slow = 1;
    } else if (mon->data == &mons[PM_IRON_GOLEM]) {
	if (damtype == AD_ELEC) slow = 1;
	else if (damtype == AD_FIRE) heal = dam;
    } else {
	return;
    }
    if (slow) {
	if (mon->mspeed != MSLOW)
	    mon_adjust_speed(mon, -1, NULL);
    }
    if (heal) {
	if (mon->mhp < mon->mhpmax) {
	    mon->mhp += dam;
	    if (mon->mhp > mon->mhpmax) mon->mhp = mon->mhpmax;
	    if (cansee(mon->mx, mon->my))
		pline("%s seems healthier.", Monnam(mon));
	}
    }
}